

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# depfile_parser_test.cc
# Opt level: O0

void __thiscall DepfileParserTestEscapedColons::Run(DepfileParserTestEscapedColons *this)

{
  Test *pTVar1;
  bool bVar2;
  size_type sVar3;
  reference pvVar4;
  string local_80;
  string local_60;
  undefined4 local_40;
  undefined1 local_30 [8];
  string err;
  DepfileParserTestEscapedColons *this_local;
  
  err.field_2._8_8_ = this;
  std::__cxx11::string::string((string *)local_30);
  pTVar1 = g_current_test;
  bVar2 = DepfileParserTest::Parse
                    (&this->super_DepfileParserTest,
                     "c\\:\\gcc\\x86_64-w64-mingw32\\include\\stddef.o: \\\n c:\\gcc\\x86_64-w64-mingw32\\include\\stddef.h \n"
                     ,(string *)local_30);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/depfile_parser_test.cc"
             ,0x9b,
             "Parse( \"c\\\\:\\\\gcc\\\\x86_64-w64-mingw32\\\\include\\\\stddef.o: \\\\\\n\" \" c:\\\\gcc\\\\x86_64-w64-mingw32\\\\include\\\\stddef.h \\n\", &err)"
            );
  pTVar1 = g_current_test;
  bVar2 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_30);
  bVar2 = testing::Test::Check
                    (pTVar1,bVar2,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/depfile_parser_test.cc"
                     ,0x9c,"\"\" == err");
  pTVar1 = g_current_test;
  if (bVar2) {
    sVar3 = std::vector<StringPiece,_std::allocator<StringPiece>_>::size
                      (&(this->super_DepfileParserTest).parser_.outs_);
    bVar2 = testing::Test::Check
                      (pTVar1,sVar3 == 1,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/depfile_parser_test.cc"
                       ,0x9d,"1u == parser_.outs_.size()");
    pTVar1 = g_current_test;
    if (bVar2) {
      pvVar4 = std::vector<StringPiece,_std::allocator<StringPiece>_>::operator[]
                         (&(this->super_DepfileParserTest).parser_.outs_,0);
      StringPiece::AsString_abi_cxx11_(&local_60,pvVar4);
      bVar2 = std::operator==("c:\\gcc\\x86_64-w64-mingw32\\include\\stddef.o",&local_60);
      testing::Test::Check
                (pTVar1,bVar2,
                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/depfile_parser_test.cc"
                 ,0x9f,
                 "\"c:\\\\gcc\\\\x86_64-w64-mingw32\\\\include\\\\stddef.o\" == parser_.outs_[0].AsString()"
                );
      std::__cxx11::string::~string((string *)&local_60);
      pTVar1 = g_current_test;
      sVar3 = std::vector<StringPiece,_std::allocator<StringPiece>_>::size
                        (&(this->super_DepfileParserTest).parser_.ins_);
      bVar2 = testing::Test::Check
                        (pTVar1,sVar3 == 1,
                         "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/depfile_parser_test.cc"
                         ,0xa0,"1u == parser_.ins_.size()");
      pTVar1 = g_current_test;
      if (bVar2) {
        pvVar4 = std::vector<StringPiece,_std::allocator<StringPiece>_>::operator[]
                           (&(this->super_DepfileParserTest).parser_.ins_,0);
        StringPiece::AsString_abi_cxx11_(&local_80,pvVar4);
        bVar2 = std::operator==("c:\\gcc\\x86_64-w64-mingw32\\include\\stddef.h",&local_80);
        testing::Test::Check
                  (pTVar1,bVar2,
                   "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/depfile_parser_test.cc"
                   ,0xa2,
                   "\"c:\\\\gcc\\\\x86_64-w64-mingw32\\\\include\\\\stddef.h\" == parser_.ins_[0].AsString()"
                  );
        std::__cxx11::string::~string((string *)&local_80);
        local_40 = 0;
      }
      else {
        testing::Test::AddAssertionFailure(g_current_test);
        local_40 = 1;
      }
    }
    else {
      testing::Test::AddAssertionFailure(g_current_test);
      local_40 = 1;
    }
  }
  else {
    testing::Test::AddAssertionFailure(g_current_test);
    local_40 = 1;
  }
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST_F(DepfileParserTest, EscapedColons)
{
  std::string err;
  // Tests for correct parsing of depfiles produced on Windows
  // by both Clang, GCC pre 10 and GCC 10
  EXPECT_TRUE(Parse(
"c\\:\\gcc\\x86_64-w64-mingw32\\include\\stddef.o: \\\n"
" c:\\gcc\\x86_64-w64-mingw32\\include\\stddef.h \n",
      &err));
  ASSERT_EQ("", err);
  ASSERT_EQ(1u, parser_.outs_.size());
  EXPECT_EQ("c:\\gcc\\x86_64-w64-mingw32\\include\\stddef.o",
            parser_.outs_[0].AsString());
  ASSERT_EQ(1u, parser_.ins_.size());
  EXPECT_EQ("c:\\gcc\\x86_64-w64-mingw32\\include\\stddef.h",
            parser_.ins_[0].AsString());
}